

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

int foldarith(BinOpr opr,ExpDesc *e1,ExpDesc *e2)

{
  GCstr *pGVar1;
  lua_Number n;
  TValue o;
  ExpDesc *e2_local;
  ExpDesc *e1_local;
  BinOpr opr_local;
  
  if ((((e1->k == VKLAST) && (e1->t == e1->f)) && (e2->k == VKLAST)) && (e2->t == e2->f)) {
    pGVar1 = (GCstr *)lj_vm_foldarith(e1->u,e2->u,opr);
    if ((NAN((double)pGVar1)) || (pGVar1 == (GCstr *)0x8000000000000000)) {
      e1_local._4_4_ = 0;
    }
    else {
      (e1->u).sval = pGVar1;
      e1_local._4_4_ = 1;
    }
  }
  else {
    e1_local._4_4_ = 0;
  }
  return e1_local._4_4_;
}

Assistant:

static int foldarith(BinOpr opr, ExpDesc *e1, ExpDesc *e2)
{
  TValue o;
  lua_Number n;
  if (!expr_isnumk_nojump(e1) || !expr_isnumk_nojump(e2)) return 0;
  n = lj_vm_foldarith(expr_numberV(e1), expr_numberV(e2), (int)opr-OPR_ADD);
  setnumV(&o, n);
  if (tvisnan(&o) || tvismzero(&o)) return 0;  /* Avoid NaN and -0 as consts. */
  if (LJ_DUALNUM) {
    int32_t k = lj_num2int(n);
    if ((lua_Number)k == n) {
      setintV(&e1->u.nval, k);
      return 1;
    }
  }
  setnumV(&e1->u.nval, n);
  return 1;
}